

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qset.h
# Opt level: O1

QList<QGraphicsItem_*> * __thiscall
QSet<QGraphicsItem_*>::values
          (QList<QGraphicsItem_*> *__return_storage_ptr__,QSet<QGraphicsItem_*> *this)

{
  ulong uVar1;
  size_t asize;
  ulong uVar2;
  Data *pDVar3;
  long in_FS_OFFSET;
  anon_struct_8_1_898a9ca8_for_storage local_30;
  long local_28;
  
  local_28 = *(long *)(in_FS_OFFSET + 0x28);
  (__return_storage_ptr__->d).d = (Data *)0x0;
  (__return_storage_ptr__->d).ptr = (QGraphicsItem **)0x0;
  (__return_storage_ptr__->d).size = 0;
  pDVar3 = (this->q_hash).d;
  if (pDVar3 == (Data *)0x0) {
    asize = 0;
  }
  else {
    asize = pDVar3->size;
  }
  QList<QGraphicsItem_*>::reserve(__return_storage_ptr__,asize);
  pDVar3 = (this->q_hash).d;
  if (pDVar3 == (Data *)0x0) {
    pDVar3 = (Data *)0x0;
  }
  else if (pDVar3->spans->offsets[0] == 0xff) {
    uVar1 = 1;
    do {
      uVar2 = uVar1;
      if (pDVar3->numBuckets == uVar2) {
        pDVar3 = (Data *)0x0;
        uVar2 = 0;
        break;
      }
      uVar1 = uVar2 + 1;
    } while (pDVar3->spans[uVar2 >> 7].offsets[(uint)uVar2 & 0x7f] == 0xff);
    goto LAB_0061e4df;
  }
  uVar2 = 0;
LAB_0061e4df:
  if (uVar2 != 0 || pDVar3 != (Data *)0x0) {
    do {
      local_30.data =
           *&pDVar3->spans[uVar2 >> 7].entries
             [pDVar3->spans[uVar2 >> 7].offsets[(uint)uVar2 & 0x7f]].storage.data;
      QtPrivate::QPodArrayOps<QGraphicsItem*>::emplace<QGraphicsItem*&>
                ((QPodArrayOps<QGraphicsItem*> *)__return_storage_ptr__,
                 (__return_storage_ptr__->d).size,(QGraphicsItem **)&local_30);
      QList<QGraphicsItem_*>::end(__return_storage_ptr__);
      do {
        if (pDVar3->numBuckets - 1 == uVar2) {
          uVar2 = 0;
          pDVar3 = (Data *)0x0;
          break;
        }
        uVar2 = uVar2 + 1;
      } while (pDVar3->spans[uVar2 >> 7].offsets[(uint)uVar2 & 0x7f] == 0xff);
    } while (uVar2 != 0 || pDVar3 != (Data *)0x0);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != local_28) {
    __stack_chk_fail();
  }
  return __return_storage_ptr__;
}

Assistant:

Q_OUTOFLINE_TEMPLATE QList<T> QSet<T>::values() const
{
    QList<T> result;
    result.reserve(size());
    typename QSet<T>::const_iterator i = constBegin();
    while (i != constEnd()) {
        result.append(*i);
        ++i;
    }
    return result;
}